

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typemapper.cpp
# Opt level: O0

void notify(string *hello)

{
  allocator<char> local_51;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  string *local_10;
  string *hello_local;
  
  local_10 = hello;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"Hello world: ",&local_51);
  std::operator+(&local_30,&local_50,local_10);
  std::__cxx11::string::operator=((string *)&notifyResult_abi_cxx11_,(string *)&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::~string((string *)&local_50);
  std::allocator<char>::~allocator(&local_51);
  return;
}

Assistant:

void notify(const std::string &hello) { notifyResult = string("Hello world: ") + hello; }